

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_AttachMasssol
              (ARKodeMem ark_mem,ARKMassInitFn minit,ARKMassSetupFn msetup,ARKMassMultFn mmult,
              ARKMassSolveFn msolve,ARKMassFreeFn mfree,int time_dep,
              SUNLinearSolver_Type msolve_type,void *mass_mem)

{
  undefined4 uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  ARKodeMem in_R9;
  int retval;
  ARKodeARKStepMem step_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_R9,in_stack_ffffffffffffffc0,
                       (ARKodeARKStepMem *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (local_4 == 0) {
    if (*(long *)(in_stack_ffffffffffffffc0 + 0x170) != 0) {
      (**(code **)(in_stack_ffffffffffffffc0 + 0x170))(in_RDI);
    }
    *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x150) = in_RSI;
    *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x158) = in_RDX;
    *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x160) = in_RCX;
    *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x168) = in_R8;
    *(ARKodeMem *)(in_stack_ffffffffffffffc0 + 0x170) = in_R9;
    *(ARKMassSolveFn *)(in_stack_ffffffffffffffc0 + 0x178) = msolve;
    uVar1 = 1;
    if ((int)step_mem != 0) {
      uVar1 = 2;
    }
    *(undefined4 *)(in_stack_ffffffffffffffc0 + 0x180) = uVar1;
    *(undefined4 *)(in_stack_ffffffffffffffc0 + 0x184) = mfree._0_4_;
    *(undefined8 *)(in_RDI + 0x220) = in_RCX;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkStep_AttachMasssol(ARKodeMem ark_mem, ARKMassInitFn minit,
                          ARKMassSetupFn msetup, ARKMassMultFn mmult,
                          ARKMassSolveFn msolve, ARKMassFreeFn mfree,
                          sunbooleantype time_dep,
                          SUNLinearSolver_Type msolve_type, void* mass_mem)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* free any existing mass matrix solver */
  if (step_mem->mfree != NULL) { step_mem->mfree(ark_mem); }

  /* Attach the provided routines, data structure and solve type */
  step_mem->minit       = minit;
  step_mem->msetup      = msetup;
  step_mem->mmult       = mmult;
  step_mem->msolve      = msolve;
  step_mem->mfree       = mfree;
  step_mem->mass_mem    = mass_mem;
  step_mem->mass_type   = (time_dep) ? MASS_TIMEDEP : MASS_FIXED;
  step_mem->msolve_type = msolve_type;

  /* Attach mmult function pointer to ark_mem as well */
  ark_mem->step_mmult = mmult;

  return (ARK_SUCCESS);
}